

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

uint8_t * __thiscall
cdns_query::parse(cdns_query *this,uint8_t *in,uint8_t *in_max,int *err,cdnsBlock *current_block)

{
  cdns *this_00;
  uint8_t *puVar1;
  int64_t iVar2;
  
  this->current_block = current_block;
  puVar1 = cbor_map_parse<cdns_query>(in,in_max,this,err);
  this_00 = current_block->current_cdns;
  if ((this_00->preamble_parsed != true) || ((this_00->preamble).cdns_version_major != 0)) {
    iVar2 = cdns::ticks_to_microseconds
                      (this_00,(long)this->time_offset_usec,
                       (current_block->preamble).block_parameter_index);
    this->time_offset_usec = (int)iVar2;
  }
  return puVar1;
}

Assistant:

uint8_t* cdns_query::parse(uint8_t* in, uint8_t const* in_max, int* err, cdnsBlock* current_block)
{
    this->current_block = current_block;
    in = cbor_map_parse(in, in_max, this, err);
    if (!current_block->current_cdns->is_old_version()) {
        time_offset_usec = (int)current_block->current_cdns->ticks_to_microseconds(time_offset_usec, 
            current_block->preamble.block_parameter_index);
    }
    return in;
}